

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArraySegment.cpp
# Opt level: O2

void Js::SparseArraySegmentBase::EnsureSizeInBound
               (uint32 left,uint32 length,uint32 *size,SparseArraySegmentBase *next)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type TVar5;
  uint uVar6;
  
  if (next == (SparseArraySegmentBase *)0x0) {
    TVar5 = 0xffffffff;
  }
  else {
    TVar5 = next->left;
  }
  uVar6 = TVar5 - left;
  if (TVar5 < left || uVar6 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                ,0x19,"(nextLeft > left)","nextLeft > left");
    if (!bVar3) goto LAB_00becd08;
    *puVar4 = 0;
  }
  uVar1 = *size;
  if (uVar1 == 0) {
    uVar6 = 0;
  }
  else {
    if (uVar1 < uVar6) {
      uVar6 = uVar1;
    }
    *size = uVar6;
  }
  if (uVar6 < length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                ,0x21,"(length <= size)","length <= size");
    if (!bVar3) {
LAB_00becd08:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void SparseArraySegmentBase::EnsureSizeInBound(uint32 left, uint32 length, uint32& size, SparseArraySegmentBase* next)
    {
        uint32 nextLeft = next ? next->left : JavascriptArray::MaxArrayLength;
        Assert(nextLeft > left);

        if(size != 0)
        {
            // Avoid writing to 'size' for an empty segment. The empty segment is a constant structure and writing to it (even
            // if it's not being changed) may cause an AV.
            size = min(size, nextLeft - left);
        }
        AssertOrFailFast(length <= size);
    }